

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtldurl.cpp
# Opt level: O1

bool __thiscall QPublicSuffixDatabase::loadFile(QPublicSuffixDatabase *this,QString *fileName)

{
  QFile *pQVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  undefined1 *puVar5;
  Data *pDVar6;
  char cVar7;
  int iVar8;
  QPublicSuffixDatabase *this_00;
  QPublicSuffixDatabase *this_01;
  long lVar9;
  storage_type *psVar10;
  bool bVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  char version;
  QArrayData *local_b0;
  undefined1 local_91 [57];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcTld();
  if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_40 = lcTld::category.name;
    QString::toUtf8_helper((QString *)((long)local_91 + 0x19));
    psVar10 = (storage_type *)local_91._33_8_;
    if ((storage_type *)local_91._33_8_ == (storage_type *)0x0) {
      psVar10 = (storage_type *)&QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_58,"Loading publicsuffix file: %s",psVar10);
    if ((QArrayData *)local_91._25_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_91._25_8_,1,0x10);
      }
    }
  }
  this_00 = (QPublicSuffixDatabase *)operator_new(0x10);
  QFile::QFile((QFile *)this_00,(QString *)fileName);
  cVar7 = (**(code **)((this_00->m_data).m_size + 0x68))(this_00,1);
  if (cVar7 == '\0') {
    lcTld();
    if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_58 = 2;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_40 = lcTld::category.name;
      QIODevice::errorString();
      QString::toUtf8_helper((QString *)((long)local_91 + 0x19));
      psVar10 = (storage_type *)local_91._33_8_;
      if ((storage_type *)local_91._33_8_ == (storage_type *)0x0) {
        psVar10 = (storage_type *)&QByteArray::_empty;
      }
      QMessageLogger::debug((char *)&local_58,"Failed to open publicsuffix file: %s",psVar10);
      if ((QArrayData *)local_91._25_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_91._25_8_,1,0x10);
        }
      }
      if ((QArrayData *)local_91._1_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_91._1_8_,2,0x10);
        }
      }
    }
  }
  else {
    this_01 = (QPublicSuffixDatabase *)(**(code **)((this_00->m_data).m_size + 0x80))(this_00);
    if (0x11 < (long)this_01) {
      local_91._41_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_91._25_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_91._33_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QIODevice::read((long)local_91 + 0x19);
      if ((_Head_base<0UL,_QFile_*,_false>)local_91._41_8_ == (_Head_base<0UL,_QFile_*,_false>)0x10)
      {
        iVar8 = bcmp((void *)local_91._33_8_,".DAFSA@PSL_0   \n",0x10);
        if (iVar8 != 0) goto LAB_00228ae3;
        cVar7 = (**(code **)((this_00->m_data).m_size + 0x88))
                          (this_00,(undefined1 *)((long)&this_01[-1].m_storage.d.size + 7));
        if (cVar7 == '\0') {
          lcTld();
          if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
            loadFile(this_00);
          }
          goto LAB_00228af6;
        }
        local_91[0] = -0x56;
        lVar9 = QIODevice::read((char *)this_00,(longlong)local_91);
        if (lVar9 != 1) {
          lcTld();
          if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
            loadFile();
          }
          goto LAB_00228af6;
        }
        if (local_91[0] != '\x01') {
          lcTld();
          if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
            loadFile((QPublicSuffixDatabase *)local_91);
          }
          goto LAB_00228af6;
        }
        puVar12 = (undefined1 *)((long)&this_01[-1].m_storage.d.d + 7);
        psVar10 = (storage_type *)QFileDevice::map(this_00,0x10,puVar12,0);
        lcTld();
        if (psVar10 == (storage_type *)0x0) {
          if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
            local_58 = 2;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            uStack_48 = 0;
            uStack_44 = 0;
            local_40 = lcTld::category.name;
            QIODevice::errorString();
            QString::toUtf8_helper((QString *)((long)local_91 + 1));
            if ((undefined8 *)local_91._9_8_ == (undefined8 *)0x0) {
              local_91._9_8_ = &QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)&local_58,"Failed to map publicsuffix file: %s",local_91._9_8_);
            if ((QArrayData *)local_91._1_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_91._1_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_91._1_8_,1,0x10);
              }
            }
            if (local_b0 != (QArrayData *)0x0) {
              LOCK();
              (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_b0,2,0x10);
              }
            }
          }
          (**(code **)((this_00->m_data).m_size + 0x88))(this_00,0x10);
          QIODevice::read((longlong)&local_58);
          pQVar2 = &((this->m_storage).d.d)->super_QArrayData;
          pcVar3 = (this->m_storage).d.ptr;
          pDVar6 = (Data *)CONCAT44(uStack_54,local_58);
          local_58 = SUB84(pQVar2,0);
          uStack_54 = (undefined4)((ulong)pQVar2 >> 0x20);
          (this->m_storage).d.d = pDVar6;
          (this->m_storage).d.ptr = (char *)CONCAT44(uStack_4c,uStack_50);
          uStack_50 = SUB84(pcVar3,0);
          uStack_4c = (undefined4)((ulong)pcVar3 >> 0x20);
          qVar4 = (this->m_storage).d.size;
          (this->m_storage).d.size = CONCAT44(uStack_44,uStack_48);
          uStack_48 = (undefined4)qVar4;
          uStack_44 = (undefined4)((ulong)qVar4 >> 0x20);
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar2,1,0x10);
            }
          }
          puVar5 = (undefined1 *)(this->m_storage).d.size;
          lcTld();
          if (puVar5 != puVar12) {
            if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
            {
              loadFile();
            }
            QByteArray::clear();
            goto LAB_00228af6;
          }
          if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
            local_58 = 2;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            uStack_48 = 0;
            uStack_44 = 0;
            local_40 = lcTld::category.name;
            QMessageLogger::debug((char *)&local_58,"Using system publicsuffix data");
          }
          pcVar3 = (this->m_storage).d.ptr;
          (this->m_data).m_size = (this->m_storage).d.size;
          (this->m_data).m_data = pcVar3;
          bVar11 = true;
        }
        else {
          if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
            local_58 = 2;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            uStack_48 = 0;
            uStack_44 = 0;
            local_40 = lcTld::category.name;
            QMessageLogger::debug((char *)&local_58,"Using mapped system publicsuffix data");
          }
          (**(code **)((this_00->m_data).m_size + 0x70))(this_00);
          (this->m_data).m_size = (qsizetype)puVar12;
          (this->m_data).m_data = psVar10;
          pQVar1 = (this->m_dev)._M_t.super___uniq_ptr_impl<QFile,_std::default_delete<QFile>_>._M_t
                   .super__Tuple_impl<0UL,_QFile_*,_std::default_delete<QFile>_>.
                   super__Head_base<0UL,_QFile_*,_false>._M_head_impl;
          (this->m_dev)._M_t.super___uniq_ptr_impl<QFile,_std::default_delete<QFile>_>._M_t.
          super__Tuple_impl<0UL,_QFile_*,_std::default_delete<QFile>_>.
          super__Head_base<0UL,_QFile_*,_false>._M_head_impl = (QFile *)this_00;
          bVar11 = true;
          if (pQVar1 != (QFile *)0x0) {
            (**(code **)(*(long *)pQVar1 + 0x20))();
          }
          this_00 = (QPublicSuffixDatabase *)0x0;
        }
      }
      else {
LAB_00228ae3:
        lcTld();
        if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
          loadFile((QPublicSuffixDatabase *)((long)local_91 + 0x19));
        }
LAB_00228af6:
        bVar11 = false;
      }
      if ((QArrayData *)local_91._25_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_91._25_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_91._25_8_,1,0x10);
        }
      }
      goto LAB_00228a5a;
    }
    lcTld();
    if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      loadFile(this_01);
    }
  }
  bVar11 = false;
LAB_00228a5a:
  if (this_00 != (QPublicSuffixDatabase *)0x0) {
    (**(code **)((this_00->m_data).m_size + 0x20))(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QPublicSuffixDatabase::loadFile(const QString &fileName)
{
    static const QByteArrayView DafsaFileHeader = ".DAFSA@PSL_0   \n";

    qCDebug(lcTld, "Loading publicsuffix file: %s", qUtf8Printable(fileName));

    auto systemFile = std::make_unique<QFile>(fileName);

    if (!systemFile->open(QIODevice::ReadOnly)) {
        qCDebug(lcTld, "Failed to open publicsuffix file: %s",
                qUtf8Printable(systemFile->errorString()));
        return false;
    }

    auto fileSize = systemFile->size();
    // Check if there is enough data for header, version byte and some data
    if (fileSize < DafsaFileHeader.size() + 2) {
        qCWarning(lcTld, "publicsuffix file is too small: %zu", std::size_t(fileSize));
        return false;
    }

    auto header = systemFile->read(DafsaFileHeader.size());
    if (header != DafsaFileHeader) {
        qCWarning(lcTld, "Invalid publicsuffix file header: %s", header.toHex().constData());
        return false;
    }

    // Check if the file is UTF-8 compatible
    if (!systemFile->seek(fileSize - 1)) {
        qCWarning(lcTld, "Failed to seek to the end of file: %s",
                  qUtf8Printable(systemFile->errorString()));
        return false;
    }

    char version;
    if (systemFile->read(&version, 1) != 1) {
        qCWarning(lcTld, "Failed to read publicsuffix version");
        return false;
    }

    if (version != 0x01) {
        qCWarning(lcTld, "Unsupported publicsuffix version: %d", int(version));
        return false;
    }

    const auto dataSize = fileSize - DafsaFileHeader.size() - 1;
    // Try to map the file first
    auto mappedData = systemFile->map(DafsaFileHeader.size(), dataSize);
    if (mappedData) {
        qCDebug(lcTld, "Using mapped system publicsuffix data");
        systemFile->close();
        m_data = QByteArrayView(mappedData, dataSize);
        m_dev = std::move(systemFile);
        return true;
    }

    qCDebug(lcTld, "Failed to map publicsuffix file: %s",
            qUtf8Printable(systemFile->errorString()));

    systemFile->seek(DafsaFileHeader.size());
    m_storage = systemFile->read(dataSize);
    if (m_storage.size() != dataSize) {
        qCWarning(lcTld, "Failed to read publicsuffix file");
        m_storage.clear();
        return false;
    }

    qCDebug(lcTld, "Using system publicsuffix data");
    m_data = m_storage;

    return true;
}